

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void AddErrorLocationInfo(char *codeStart,char *errorPos,char *errorBuf,uint errorBufSize)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *dst;
  bool bVar7;
  char local_84;
  char *local_80;
  uint local_64;
  char *pcStack_60;
  uint i;
  char *pos;
  uint spacing;
  uint line;
  char *errorCurrBefore;
  char *end;
  char *start;
  char *codeEnd;
  char *errorCurr;
  uint errorBufSize_local;
  char *errorBuf_local;
  char *errorPos_local;
  char *codeStart_local;
  
  if ((errorBuf != (char *)0x0) && (errorBufSize != 0)) {
    sVar6 = strlen(errorBuf);
    dst = errorBuf + sVar6;
    iVar1 = (int)dst;
    iVar2 = (int)errorBuf;
    if ((codeStart == (char *)0x0) || (errorPos == (char *)0x0)) {
      NULLC::SafeSprintf(dst,(ulong)(errorBufSize - (iVar1 - iVar2)),"\n");
    }
    else {
      sVar6 = strlen(codeStart);
      if ((errorPos < codeStart) || (codeStart + sVar6 < errorPos)) {
        NULLC::SafeSprintf(dst,(ulong)(errorBufSize - (iVar1 - iVar2)),"\n");
      }
      else {
        local_80 = errorPos;
        if (errorPos != codeStart + sVar6) {
          local_80 = errorPos + 1;
        }
        errorCurrBefore = local_80;
        end = errorPos;
        while( true ) {
          bVar7 = false;
          if ((codeStart < end) && (bVar7 = false, end[-1] != '\r')) {
            bVar7 = end[-1] != '\n';
          }
          if (!bVar7) break;
          end = end + -1;
        }
        while( true ) {
          bVar7 = false;
          if ((*errorCurrBefore != '\0') && (bVar7 = false, *errorCurrBefore != '\r')) {
            bVar7 = *errorCurrBefore != '\n';
          }
          if (!bVar7) break;
          errorCurrBefore = errorCurrBefore + 1;
        }
        codeEnd = dst;
        if ((uint)(iVar1 - iVar2) < errorBufSize) {
          codeEnd = dst + 1;
          *dst = '\n';
        }
        uVar3 = GetErrorLocationLineNumber(codeStart,errorPos);
        iVar1 = (int)codeEnd;
        if (uVar3 == 0) {
          iVar4 = NULLC::SafeSprintf(codeEnd,(ulong)(errorBufSize - (iVar1 - iVar2)),"  at \'");
        }
        else {
          iVar4 = NULLC::SafeSprintf(codeEnd,(ulong)(errorBufSize - (iVar1 - iVar2)),
                                     "  at line %d: \'",(ulong)uVar3);
        }
        codeEnd = codeEnd + iVar4;
        iVar4 = (int)codeEnd;
        for (pcStack_60 = end; *pcStack_60 != '\0' && pcStack_60 < errorCurrBefore;
            pcStack_60 = pcStack_60 + 1) {
          if ((uint)((int)codeEnd - iVar2) < errorBufSize) {
            if (*pcStack_60 == '\t') {
              local_84 = ' ';
            }
            else {
              local_84 = *pcStack_60;
            }
            *codeEnd = local_84;
            codeEnd = codeEnd + 1;
          }
        }
        iVar5 = NULLC::SafeSprintf(codeEnd,(ulong)(errorBufSize - ((int)codeEnd - iVar2)),"\'\n");
        codeEnd = codeEnd + iVar5;
        for (local_64 = 0; local_64 < (uint)((iVar4 - iVar1) + ((int)errorPos - (int)end));
            local_64 = local_64 + 1) {
          if ((uint)((int)codeEnd - iVar2) < errorBufSize) {
            *codeEnd = ' ';
            codeEnd = codeEnd + 1;
          }
        }
        NULLC::SafeSprintf(codeEnd,(ulong)(errorBufSize - ((int)codeEnd - iVar2)),"^\n");
        errorBuf[errorBufSize - 1] = '\0';
      }
    }
  }
  return;
}

Assistant:

void AddErrorLocationInfo(const char *codeStart, const char *errorPos, char *errorBuf, unsigned errorBufSize)
{
	if(!errorBuf || !errorBufSize)
		return;

	char *errorCurr = errorBuf + strlen(errorBuf);

	if(!codeStart || !errorPos)
	{
		errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "\n");
		return;
	}

	const char *codeEnd = codeStart + strlen(codeStart);

	if(errorPos < codeStart || errorPos > codeEnd)
	{
		errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "\n");
		return;
	}

	const char *start = errorPos;
	const char *end = start == codeEnd ? start : start + 1;

	while(start > codeStart && *(start - 1) != '\r' && *(start - 1) != '\n')
		start--;

	while(*end && *end != '\r' && *end != '\n')
		end++;

	if(errorBufSize > unsigned(errorCurr - errorBuf))
		*(errorCurr++) = '\n';

	char *errorCurrBefore = errorCurr;

	if(unsigned line = GetErrorLocationLineNumber(codeStart, errorPos))
		errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "  at line %d: '", line);
	else
		errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "  at '");

	unsigned spacing = unsigned(errorCurr - errorCurrBefore);

	for(const char *pos = start; *pos && pos < end; pos++)
	{
		if(errorBufSize > unsigned(errorCurr - errorBuf))
			*(errorCurr++) = *pos == '\t' ? ' ' : *pos;
	}

	errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "'\n");

	for(unsigned i = 0; i < spacing + unsigned(errorPos - start); i++)
	{
		if(errorBufSize > unsigned(errorCurr - errorBuf))
			*(errorCurr++) = ' ';
	}

	errorCurr += NULLC::SafeSprintf(errorCurr, errorBufSize - unsigned(errorCurr - errorBuf), "^\n");

	errorBuf[errorBufSize - 1] = '\0';
}